

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O2

bool __thiscall
raft_functional_common::TestSm::isSame(TestSm *this,TestSm *with,bool check_precommit)

{
  int iVar1;
  const_iterator cVar2;
  size_t sVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *pbVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *__mutex_00;
  bool bVar9;
  ptr<buffer> e1_buf;
  ptr<buffer> e2_buf;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_50;
  map<unsigned_long,_std::shared_ptr<nuraft::buffer>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
  *local_40;
  _Base_ptr local_38;
  
  if (this < with) {
    __mutex_00 = (pthread_mutex_t *)&this->dataLock;
    std::mutex::lock((mutex *)&__mutex_00->__data);
    __mutex = (pthread_mutex_t *)&with->dataLock;
    std::mutex::lock((mutex *)&__mutex->__data);
  }
  else {
    __mutex_00 = (pthread_mutex_t *)&with->dataLock;
    std::mutex::lock((mutex *)&__mutex_00->__data);
    __mutex = (pthread_mutex_t *)&this->dataLock;
    std::mutex::lock((mutex *)&__mutex->__data);
  }
  pthread_mutex_unlock(__mutex);
  pthread_mutex_unlock(__mutex_00);
  if (check_precommit) {
    if ((this->preCommits)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        (with->preCommits)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      return false;
    }
    local_40 = &with->preCommits;
    local_38 = &(with->preCommits)._M_t._M_impl.super__Rb_tree_header._M_header;
    for (p_Var7 = (this->preCommits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(this->preCommits)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      cVar2 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
              ::find(&local_40->_M_t,(key_type *)(p_Var7 + 1));
      if (cVar2._M_node == local_38) {
        return false;
      }
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,
                 (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&p_Var7[1]._M_parent);
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)
                 &cVar2._M_node[1]._M_parent);
      sVar3 = nuraft::buffer::size(local_60._M_ptr);
      sVar4 = nuraft::buffer::size(local_50._M_ptr);
      if (sVar3 != sVar4) goto LAB_001b3911;
      nuraft::buffer::pos(local_60._M_ptr,0);
      nuraft::buffer::pos(local_50._M_ptr,0);
      pbVar5 = nuraft::buffer::data(local_60._M_ptr);
      pbVar6 = nuraft::buffer::data(local_50._M_ptr);
      sVar3 = nuraft::buffer::size(local_60._M_ptr);
      iVar1 = bcmp(pbVar5,pbVar6,sVar3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      if (iVar1 != 0) {
        return false;
      }
    }
  }
  if ((this->commits)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (with->commits)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    local_40 = &with->commits;
    p_Var8 = (this->commits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      bVar9 = (_Rb_tree_header *)p_Var8 == &(this->commits)._M_t._M_impl.super__Rb_tree_header;
      if (bVar9) {
        return bVar9;
      }
      cVar2 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::buffer>_>_>_>
              ::find(&local_40->_M_t,(key_type *)(p_Var8 + 1));
      if ((_Rb_tree_header *)cVar2._M_node == &(with->commits)._M_t._M_impl.super__Rb_tree_header) {
        return bVar9;
      }
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,
                 (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&p_Var8[1]._M_parent);
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)
                 &cVar2._M_node[1]._M_parent);
      sVar3 = nuraft::buffer::size(local_60._M_ptr);
      sVar4 = nuraft::buffer::size(local_50._M_ptr);
      if (sVar3 != sVar4) break;
      nuraft::buffer::pos(local_60._M_ptr,0);
      nuraft::buffer::pos(local_50._M_ptr,0);
      pbVar5 = nuraft::buffer::data(local_60._M_ptr);
      pbVar6 = nuraft::buffer::data(local_50._M_ptr);
      sVar3 = nuraft::buffer::size(local_60._M_ptr);
      iVar1 = bcmp(pbVar5,pbVar6,sVar3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      if (iVar1 != 0) {
        return bVar9;
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    }
LAB_001b3911:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  }
  return false;
}

Assistant:

bool isSame(const TestSm& with, bool check_precommit = false) {
        // NOTE:
        //   To avoid false alarm by TSAN (regarding lock order inversion),
        //   always grab lock of the smaller address one first.
        if (this < &with) {
            std::lock_guard<std::mutex> ll_mine(dataLock);
            std::lock_guard<std::mutex> ll_with(with.dataLock);
        } else {
            std::lock_guard<std::mutex> ll_with(with.dataLock);
            std::lock_guard<std::mutex> ll_mine(dataLock);
        }

        if (check_precommit) {
            if (preCommits.size() != with.preCommits.size()) return false;
            for (auto& e1: preCommits) {
                auto e2 = with.preCommits.find(e1.first);
                if (e2 == with.preCommits.end()) return false;

                ptr<buffer> e1_buf = e1.second;
                ptr<buffer> e2_buf = e2->second;
                if (e1_buf->size() != e2_buf->size()) return false;

                e1_buf->pos(0);
                e2_buf->pos(0);
                if ( memcmp( e1_buf->data(),
                             e2_buf->data(),
                             e1_buf->size() ) ) return false;
            }
        }

        if (commits.size() != with.commits.size()) return false;
        for (auto& e1: commits) {
            auto e2 = with.commits.find(e1.first);
            if (e2 == with.commits.end()) return false;

            ptr<buffer> e1_buf = e1.second;
            ptr<buffer> e2_buf = e2->second;
            if (e1_buf->size() != e2_buf->size()) return false;

            e1_buf->pos(0);
            e2_buf->pos(0);
            if ( memcmp( e1_buf->data(),
                         e2_buf->data(),
                         e1_buf->size() ) ) return false;
        }

        return true;
    }